

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O1

double runWBICMetropolis(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *frequencyMatrix,
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *docVoca,vector<double,_std::allocator<double>_> *alpha,
                        vector<double,_std::allocator<double>_> *beta,uint n)

{
  pointer pdVar1;
  pointer pdVar2;
  double dVar3;
  vector<double,_std::allocator<double>_> *__x;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  uint K;
  uint D;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  phiCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  thetaCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  phi;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  theta;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrix;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrix;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrixCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrixCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrixUniform;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrixUniform;
  random_device rnd;
  mt19937 mt;
  int local_2988;
  uint local_2980;
  uint local_297c;
  double local_2978;
  double local_2970;
  value_type *local_2968;
  double local_2960;
  int local_2954;
  double local_2950;
  double local_2948;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_2940;
  vector<double,_std::allocator<double>_> *local_2938;
  double local_2930;
  double local_2928;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_2920;
  double local_2918;
  double local_2910;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2908;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2890;
  double local_2878;
  double local_2870;
  double local_2868;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2860;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2848;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2830;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2818;
  vector<double,_std::allocator<double>_> local_2800;
  vector<double,_std::allocator<double>_> local_27e8;
  vector<double,_std::allocator<double>_> local_27d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_27b8;
  vector<double,_std::allocator<double>_> local_27a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2788;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2770;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2758;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_2978 = (double)(((long)(docVoca->
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(docVoca->
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3) *
                       -0x5555555555555555);
  local_297c = SUB84(local_2978,0);
  uVar12 = (ulong)((long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar5 = (uint)uVar12;
  uVar6 = (ulong)((long)(beta->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(beta->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  local_2988 = (int)uVar6;
  if ((n == 0) && (local_297c != 0)) {
    uVar9 = 0;
    do {
      if (local_2988 != 0) {
        uVar10 = 0;
        do {
          n = n + *(int *)(*(long *)&(frequencyMatrix->
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar9].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + uVar10 * 4);
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0xffffffff) != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != ((ulong)local_2978 & 0xffffffff));
  }
  uVar9 = (ulong)local_2978 & 0xffffffff;
  local_2980 = uVar5;
  local_2968 = beta;
  local_2940 = frequencyMatrix;
  local_2938 = alpha;
  local_2920 = docVoca;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2890,uVar9,alpha,(allocator_type *)&local_2740);
  uVar10 = uVar12 & 0xffffffff;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_28a8,uVar10,local_2968,(allocator_type *)&local_2740);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2848,uVar9,alpha,(allocator_type *)&local_2740);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2860,uVar10,local_2968,(allocator_type *)&local_2740);
  __x = local_2938;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2818,uVar9,local_2938,(allocator_type *)&local_2740);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2830,uVar10,local_2968,(allocator_type *)&local_2740);
  if (local_2978._0_4_ != 0) {
    uVar9 = 0;
    do {
      if (uVar5 != 0) {
        pdVar1 = local_2818.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar10 = 0;
        do {
          pdVar1[uVar10] = 1.0;
          uVar10 = uVar10 + 1;
        } while ((uVar12 & 0xffffffff) != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != ((ulong)local_2978 & 0xffffffff));
  }
  if (uVar5 != 0) {
    uVar9 = 0;
    do {
      if (local_2988 != 0) {
        pdVar1 = local_2830.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar10 = 0;
        do {
          pdVar1[uVar10] = 1.0;
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0xffffffff) != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar12 & 0xffffffff));
  }
  samplingParamFromDirichlet(&local_28c0,&local_2818,&local_297c);
  samplingParamFromDirichlet(&local_28d8,&local_2830,&local_2980);
  local_2948 = calculateLogLikelihood(&local_28c0,&local_28d8,local_2940,local_2920);
  std::vector<double,_std::allocator<double>_>::vector(&local_27d0,__x);
  std::vector<double,_std::allocator<double>_>::vector(&local_27e8,local_2968);
  local_2928 = calculateLogPriorDistributionValue(&local_28c0,&local_28d8,&local_27d0,&local_27e8);
  if (local_27e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_27e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_27d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_27d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2878 = (double)n;
  local_2960 = log(local_2878);
  std::random_device::random_device(&local_2740);
  uVar4 = std::random_device::_M_getval();
  local_2918 = (1.0 / local_2960) * local_2948 + local_2928;
  local_13b8._M_x[0] = (unsigned_long)uVar4;
  lVar8 = 1;
  uVar9 = local_13b8._M_x[0];
  do {
    uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar8);
    local_13b8._M_x[lVar8] = uVar9;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_13b8._M_p = 0x270;
  if (SUB84(local_2978,0) != 0) {
    uVar9 = 0;
    do {
      if (uVar5 != 0) {
        pdVar1 = local_28c0.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar2 = local_2890.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar10 = 0;
        do {
          pdVar2[uVar10] = pdVar1[uVar10] * (double)(uVar5 * 999) + 1.0;
          uVar10 = uVar10 + 1;
        } while ((uVar12 & 0xffffffff) != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != ((ulong)local_2978 & 0xffffffff));
  }
  if (uVar5 != 0) {
    uVar9 = 0;
    do {
      if (local_2988 != 0) {
        pdVar1 = local_28d8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar2 = local_28a8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar10 = 0;
        do {
          pdVar2[uVar10] = pdVar1[uVar10] * (double)(uint)(local_2988 * 999) + 1.0;
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0xffffffff) != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar12 & 0xffffffff));
  }
  uVar12 = (ulong)local_2980;
  local_2978 = (double)(uVar5 * 1000 - local_2980);
  local_2928 = (double)(uint)(local_2988 * 999);
  uVar9 = (ulong)local_297c;
  local_2970 = 0.0;
  local_2960 = 0.0;
  local_2954 = 0;
  do {
    samplingParamFromDirichlet(&local_28f0,&local_2890,&local_297c);
    samplingParamFromDirichlet(&local_2908,&local_28a8,&local_2980);
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        if (uVar12 != 0) {
          pdVar1 = local_28f0.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2 = local_2848.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            pdVar2[uVar11] = pdVar1[uVar11] * local_2978 + 1.0;
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
    }
    if (uVar12 != 0) {
      uVar10 = 0;
      do {
        if (local_2988 != 0) {
          pdVar1 = local_2908.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2 = local_2860.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            pdVar2[uVar11] = pdVar1[uVar11] * local_2928 + 1.0;
            uVar11 = uVar11 + 1;
          } while ((uVar6 & 0xffffffff) != uVar11);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar12);
    }
    local_2910 = calculateLogLikelihood(&local_28f0,&local_2908,local_2940,local_2920);
    std::vector<double,_std::allocator<double>_>::vector(&local_2800,local_2938);
    std::vector<double,_std::allocator<double>_>::vector(&local_27a0,local_2968);
    local_2950 = calculateLogPriorDistributionValue(&local_28f0,&local_2908,&local_2800,&local_27a0)
    ;
    if (local_27a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_27a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2800.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2800.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_2930 = log(local_2878);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_27b8,&local_2890);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_2758,&local_28a8);
    local_2868 = calculateLogProposalDistributionValue
                           (&local_28f0,&local_2908,&local_27b8,&local_2758);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2758);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_27b8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_2770,&local_2848);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_2788,&local_2860);
    dVar3 = local_2960;
    local_2870 = calculateLogProposalDistributionValue
                           (&local_28c0,&local_28d8,&local_2770,&local_2788);
    local_2950 = (1.0 / local_2930) * local_2910 + local_2950;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2788);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2770);
    local_2930 = exp(((local_2950 - local_2918) + local_2870) - local_2868);
    dVar13 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&local_13b8);
    if (dVar13 < local_2930) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_28c0,&local_28f0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_28d8,&local_2908);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_2890,&local_2848);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_28a8,&local_2860);
      local_2954 = local_2954 + 1;
      local_2948 = local_2910;
      local_2918 = local_2950;
    }
    if ((49999 < SUB84(dVar3,0)) &&
       (uVar5 = SUB84(dVar3,0) * -0x3d70a3d7 + 0xc28f5459,
       (uVar5 >> 2 | uVar5 * 0x40000000) < 0x28f5c29)) {
      local_2970 = local_2970 + local_2948;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2908);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_28f0);
    uVar5 = SUB84(local_2960,0) + 1;
    local_2960 = (double)(ulong)uVar5;
  } while (uVar5 != 60000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"acceptanceTimes: ",0x11)
  ;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::random_device::_M_fini();
  local_2970 = local_2970 / 100.0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28d8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28c0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2830);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2818);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2860);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2848);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28a8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2890);
  return local_2970;
}

Assistant:

double runWBICMetropolis(const vector<vector<unsigned int> > &frequencyMatrix, const vector<vector<unsigned int> > &docVoca, const vector<double> &alpha, const vector<double> &beta, unsigned int n){
    unsigned int D = docVoca.size(), K = alpha.size(), V = beta.size();
    if(n==0){
        for(int d=0; d<D; d++){
            for(int v=0; v<V; v++){
                n += frequencyMatrix[d][v];
            }
        }
    }
    vector<vector<double> > alphaMatrix(D, alpha);
    vector<vector<double> > betaMatrix(K, beta);
    vector<vector<double> > alphaMatrixCandidate(D, alpha);
    vector<vector<double> > betaMatrixCandidate(K, beta);
    vector<vector<double> > alphaMatrixUniform(D, alpha);
    vector<vector<double> > betaMatrixUniform(K, beta);
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            alphaMatrixUniform[d][k] = 1;
        }
    }
    for(int k=0; k<K; k++){
        for(int v=0; v<V; v++){
            betaMatrixUniform[k][v] = 1;
        }
    }
    unsigned int iteration = 60000;
    unsigned int burnIn = 50000;
    unsigned int samplingInterval = 100;
    const unsigned int RATE = 1000;
    unsigned int samplingTimes = (iteration - burnIn) / samplingInterval;
    unsigned int acceptanceTimes = 0;
    double logLikelihoodAverage = 0.0;
    vector<vector<double> > theta = samplingParamFromDirichlet(alphaMatrixUniform, D);
    vector<vector<double> > phi = samplingParamFromDirichlet(betaMatrixUniform, K);
    double logLikelihood = calculateLogLikelihood(theta, phi, frequencyMatrix, docVoca);
    double logPriorDistributionValue = calculateLogPriorDistributionValue(theta, phi, alpha, beta);
    double logTargetDistributionValue = calculateLogTargetDistributionValue(logLikelihood, logPriorDistributionValue, n);
    // double logTargetDistributionValue = 0;
    random_device rnd;
    mt19937 mt(rnd());
    uniform_real_distribution<double> randN(0,1);
    const unsigned int alphaSum = RATE * K;
    const unsigned int betaSum = RATE * V;
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            alphaMatrix[d][k] = theta[d][k] * (alphaSum - K) + 1;
        }
    }
    for(int k=0; k<K; k++){
        for(int v=0; v<V; v++){
            betaMatrix[k][v] = phi[k][v] * (betaSum - V) + 1;
        }
    }
    for(int i=0; i<iteration; i++){
        vector<vector<double> > thetaCandidate = samplingParamFromDirichlet(alphaMatrix, D);
        vector<vector<double> > phiCandidate = samplingParamFromDirichlet(betaMatrix, K);

        for(int d=0; d<D; d++){
            for(int k=0; k<K; k++){
                alphaMatrixCandidate[d][k] = thetaCandidate[d][k] * (alphaSum - K) + 1;
            }
        }
        for(int k=0; k<K; k++){
            for(int v=0; v<V; v++){
                betaMatrixCandidate[k][v] = phiCandidate[k][v] * (betaSum - V) + 1;
            }
        }
        double logLikelihoodCandidate = calculateLogLikelihood(thetaCandidate, phiCandidate, frequencyMatrix, docVoca);
        double logPriorDistributionValueCandidate = calculateLogPriorDistributionValue(thetaCandidate, phiCandidate, alpha, beta);
        double logTargetDistributionValueCandidate = calculateLogTargetDistributionValue(logLikelihoodCandidate, logPriorDistributionValueCandidate, n);
        double logProposalDistributionValueToCandidate = calculateLogProposalDistributionValue(thetaCandidate, phiCandidate, alphaMatrix, betaMatrix);
        double logProposalDistributionValueToSample = calculateLogProposalDistributionValue(theta, phi, alphaMatrixCandidate, betaMatrixCandidate);

        double acceptanceProb = exp(logTargetDistributionValueCandidate - logTargetDistributionValue + logProposalDistributionValueToSample - logProposalDistributionValueToCandidate);
        double randomValue = randN(mt);
        if(acceptanceProb > randomValue){
            acceptanceTimes += 1;
            theta = thetaCandidate;
            phi = phiCandidate;
            alphaMatrix = alphaMatrixCandidate;
            betaMatrix = betaMatrixCandidate;
            logLikelihood = logLikelihoodCandidate;
            logPriorDistributionValue = logPriorDistributionValueCandidate;
            logTargetDistributionValue = logTargetDistributionValueCandidate;
        }
        if((i > burnIn-1) && (i-burnIn+1)%samplingInterval == 0){
            logLikelihoodAverage += logLikelihood;
        }
    }
    logLikelihoodAverage /= samplingTimes;
    cout<<"acceptanceTimes: "<<acceptanceTimes<<endl;
    return logLikelihoodAverage;
}